

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O0

QWidget * __thiscall QSplitter::replaceWidget(QSplitter *this,int index,QWidget *widget)

{
  QSplitterLayoutStruct *pQVar1;
  byte bVar2;
  bool bVar3;
  QSplitterPrivate *r;
  qsizetype qVar4;
  const_reference ppQVar5;
  QSplitterPrivate *pQVar6;
  QWidget *in_RDX;
  uint in_ESI;
  QSplitterPrivate *in_RDI;
  long in_FS_OFFSET;
  bool wasHidden;
  QWidget *current;
  QSplitterLayoutStruct *s;
  QSplitterPrivate *d;
  QRect geom;
  QScopedValueRollback<bool> b;
  bool *in_stack_fffffffffffffef8;
  QScopedValueRollback<bool> *in_stack_ffffffffffffff00;
  QWidget *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff18;
  QWidget *local_b0;
  char local_98 [32];
  char local_78 [32];
  char local_58 [32];
  char local_38 [32];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  r = d_func((QSplitter *)0x69ca89);
  if (in_RDX == (QWidget *)0x0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_RDI,(char *)in_stack_ffffffffffffff08,
               (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),in_stack_fffffffffffffef8);
    QMessageLogger::warning(local_38,"QSplitter::replaceWidget: Widget can\'t be null");
    local_b0 = (QWidget *)0x0;
  }
  else {
    if (-1 < (int)in_ESI) {
      in_stack_ffffffffffffff08 = (QWidget *)(long)(int)in_ESI;
      qVar4 = QList<QSplitterLayoutStruct_*>::size(&r->list);
      if ((long)in_stack_ffffffffffffff08 < qVar4) {
        ppQVar5 = QList<QSplitterLayoutStruct_*>::at
                            ((QList<QSplitterLayoutStruct_*> *)in_stack_ffffffffffffff00,
                             (qsizetype)in_stack_fffffffffffffef8);
        pQVar1 = *ppQVar5;
        local_b0 = pQVar1->widget;
        if (local_b0 == in_RDX) {
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_RDI,(char *)in_stack_ffffffffffffff08,
                     (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),in_stack_fffffffffffffef8);
          QMessageLogger::warning
                    (local_78,"QSplitter::replaceWidget: Trying to replace a widget with itself");
          local_b0 = (QWidget *)0x0;
        }
        else {
          pQVar6 = (QSplitterPrivate *)QWidget::parentWidget((QWidget *)0x69cbb9);
          if (pQVar6 == in_RDI) {
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)in_RDI,(char *)in_stack_ffffffffffffff08,
                       (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),in_stack_fffffffffffffef8);
            QMessageLogger::warning
                      (local_98,
                       "QSplitter::replaceWidget: Trying to replace a widget with one of its siblings"
                      );
            local_b0 = (QWidget *)0x0;
          }
          else {
            local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QScopedValueRollback<bool>::QScopedValueRollback
                      (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                       SUB81((ulong)in_stack_ffffffffffffff08 >> 0x38,0));
            QWidget::geometry(local_b0);
            bVar2 = QWidget::isHidden((QWidget *)0x69cc70);
            pQVar1->widget = in_RDX;
            QWidget::setParent(local_b0,(QWidget *)CONCAT17(bVar2,in_stack_ffffffffffffff18));
            QWidget::setParent(local_b0,(QWidget *)CONCAT17(bVar2,in_stack_ffffffffffffff18));
            QWidget::setGeometry(in_RDX,(QRect *)r);
            QWidget::lower((QWidget *)in_RDI);
            if ((bVar2 & 1) == 0) {
              bVar3 = QSplitterPrivate::shouldShowWidget(in_RDI,in_stack_ffffffffffffff08);
              if (bVar3) {
                QWidget::show((QWidget *)in_RDI);
              }
            }
            else {
              QWidget::hide((QWidget *)0x69cccb);
            }
            QScopedValueRollback<bool>::~QScopedValueRollback
                      ((QScopedValueRollback<bool> *)local_18);
          }
        }
        goto LAB_0069cd05;
      }
    }
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_RDI,(char *)in_stack_ffffffffffffff08,
               (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),in_stack_fffffffffffffef8);
    QMessageLogger::warning
              (local_58,"QSplitter::replaceWidget: Index %d out of range",(ulong)in_ESI);
    local_b0 = (QWidget *)0x0;
  }
LAB_0069cd05:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_b0;
}

Assistant:

QWidget *QSplitter::replaceWidget(int index, QWidget *widget)
{
    Q_D(QSplitter);
    if (!widget) {
        qWarning("QSplitter::replaceWidget: Widget can't be null");
        return nullptr;
    }

    if (index < 0 || index >= d->list.size()) {
        qWarning("QSplitter::replaceWidget: Index %d out of range", index);
        return nullptr;
    }

    QSplitterLayoutStruct *s = d->list.at(index);
    QWidget *current = s->widget;
    if (current == widget) {
        qWarning("QSplitter::replaceWidget: Trying to replace a widget with itself");
        return nullptr;
    }

    if (widget->parentWidget() == this) {
        qWarning("QSplitter::replaceWidget: Trying to replace a widget with one of its siblings");
        return nullptr;
    }

    QScopedValueRollback b(d->blockChildAdd, true);

    const QRect geom = current->geometry();
    const bool wasHidden = current->isHidden();

    s->widget = widget;
    current->setParent(nullptr);
    widget->setParent(this);

    // The splitter layout struct's geometry is already set and
    // should not change. Only set the geometry on the new widget
    widget->setGeometry(geom);
    widget->lower();
    if (wasHidden)
        widget->hide();
    else if (d->shouldShowWidget(widget))
        widget->show();

    return current;
}